

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printer.cpp
# Opt level: O1

string * libcellml::printMapVariables
                   (string *__return_storage_ptr__,VariablePairPtr *variablePair,IdList *idList,
                   bool autoIds)

{
  size_type *psVar1;
  long lVar2;
  long *plVar3;
  undefined8 *puVar4;
  VariablePairImpl *pVVar5;
  VariablePtr *variable2;
  VariablePairImpl *pVVar6;
  element_type *peVar7;
  undefined8 uVar8;
  element_type *peVar9;
  VariablePairImpl *pVVar10;
  string mappingId;
  undefined1 local_118 [24];
  __weak_count<(__gnu_cxx::_Lock_policy)2> _Stack_100;
  undefined1 local_f8 [32];
  string local_d8;
  undefined1 local_b8 [32];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_98;
  string local_90;
  VariablePair local_70;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_68;
  VariablePair local_60;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_58;
  string local_50;
  
  VariablePair::variable1(&local_60);
  NamedEntity::name_abi_cxx11_(&local_50,(NamedEntity *)local_60.mPimpl);
  plVar3 = (long *)std::__cxx11::string::replace((ulong)&local_50,0,(char *)0x0,0x2b541a);
  pVVar6 = (VariablePairImpl *)(local_b8 + 0x10);
  pVVar10 = (VariablePairImpl *)(plVar3 + 2);
  if ((VariablePairImpl *)*plVar3 == pVVar10) {
    local_b8._16_8_ =
         (pVVar10->mVariable1).super___weak_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>.
         _M_ptr;
    local_b8._24_8_ = plVar3[3];
    local_b8._0_8_ = pVVar6;
  }
  else {
    local_b8._16_8_ =
         (pVVar10->mVariable1).super___weak_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>.
         _M_ptr;
    local_b8._0_8_ = (VariablePairImpl *)*plVar3;
  }
  local_b8._8_8_ = plVar3[1];
  *plVar3 = (long)pVVar10;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  plVar3 = (long *)std::__cxx11::string::append(local_b8);
  local_f8._0_8_ = local_f8 + 0x10;
  pVVar10 = (VariablePairImpl *)(plVar3 + 2);
  if ((VariablePairImpl *)*plVar3 == pVVar10) {
    local_f8._16_8_ =
         (pVVar10->mVariable1).super___weak_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>.
         _M_ptr;
    local_f8._24_8_ = plVar3[3];
  }
  else {
    local_f8._16_8_ =
         (pVVar10->mVariable1).super___weak_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>.
         _M_ptr;
    local_f8._0_8_ = (VariablePairImpl *)*plVar3;
  }
  local_f8._8_8_ = plVar3[1];
  *plVar3 = (long)pVVar10;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  plVar3 = (long *)std::__cxx11::string::append(local_f8);
  pVVar10 = (VariablePairImpl *)(local_118 + 0x10);
  pVVar5 = (VariablePairImpl *)(plVar3 + 2);
  if ((VariablePairImpl *)*plVar3 == pVVar5) {
    local_118._16_8_ =
         (pVVar5->mVariable1).super___weak_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>.
         _M_ptr;
    _Stack_100._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)plVar3[3];
    local_118._0_8_ = pVVar10;
  }
  else {
    local_118._16_8_ =
         (pVVar5->mVariable1).super___weak_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>.
         _M_ptr;
    local_118._0_8_ = (VariablePairImpl *)*plVar3;
  }
  local_118._8_8_ = plVar3[1];
  *plVar3 = (long)pVVar5;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  VariablePair::variable2(&local_70);
  NamedEntity::name_abi_cxx11_(&local_90,(NamedEntity *)local_70.mPimpl);
  peVar9 = (element_type *)((long)(_func_int ***)local_118._8_8_ + local_90._M_string_length);
  peVar7 = (element_type *)0xf;
  if ((VariablePairImpl *)local_118._0_8_ != pVVar10) {
    peVar7 = (element_type *)local_118._16_8_;
  }
  if (peVar7 < peVar9) {
    uVar8 = (element_type *)0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90._M_dataplus._M_p != &local_90.field_2) {
      uVar8 = local_90.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar8 < peVar9) goto LAB_00255683;
    puVar4 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_90,0,(char *)0x0,local_118._0_8_);
  }
  else {
LAB_00255683:
    puVar4 = (undefined8 *)
             std::__cxx11::string::_M_append(local_118,(ulong)local_90._M_dataplus._M_p);
  }
  local_d8._M_dataplus._M_p = (pointer)&local_d8.field_2;
  psVar1 = puVar4 + 2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*puVar4 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar1) {
    local_d8.field_2._M_allocated_capacity = *psVar1;
    local_d8.field_2._8_8_ = puVar4[3];
  }
  else {
    local_d8.field_2._M_allocated_capacity = *psVar1;
    local_d8._M_dataplus._M_p = (pointer)*puVar4;
  }
  local_d8._M_string_length = puVar4[1];
  *puVar4 = psVar1;
  puVar4[1] = 0;
  *(undefined1 *)psVar1 = 0;
  plVar3 = (long *)std::__cxx11::string::append((char *)&local_d8);
  local_98 = &__return_storage_ptr__->field_2;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)local_98;
  variable2 = (VariablePtr *)(plVar3 + 2);
  if ((VariablePtr *)*plVar3 == variable2) {
    lVar2 = plVar3[3];
    local_98->_M_allocated_capacity =
         (size_type)
         (variable2->super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
    *(long *)((long)&__return_storage_ptr__->field_2 + 8) = lVar2;
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)*plVar3;
    (__return_storage_ptr__->field_2)._M_allocated_capacity =
         (size_type)
         (variable2->super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  }
  __return_storage_ptr__->_M_string_length = plVar3[1];
  *plVar3 = (long)variable2;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
    operator_delete(local_d8._M_dataplus._M_p,local_d8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != &local_90.field_2) {
    operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
  }
  if (local_68 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_68);
  }
  if ((VariablePairImpl *)local_118._0_8_ != pVVar10) {
    operator_delete((void *)local_118._0_8_,
                    (ulong)((long)&(((NamedEntity *)local_118._16_8_)->super_ParentedEntity).
                                   super_Entity._vptr_Entity + 1));
  }
  if ((VariablePairImpl *)local_f8._0_8_ != (VariablePairImpl *)(local_f8 + 0x10)) {
    operator_delete((void *)local_f8._0_8_,(ulong)(local_f8._16_8_ + 1));
  }
  if ((VariablePairImpl *)local_b8._0_8_ != pVVar6) {
    operator_delete((void *)local_b8._0_8_,(ulong)(local_b8._16_8_ + 1));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  if (local_58 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_58);
  }
  VariablePair::variable1((VariablePair *)local_118);
  VariablePair::variable2((VariablePair *)local_f8);
  Variable::equivalenceMappingId_abi_cxx11_
            (&local_d8,(Variable *)local_118,(VariablePtr *)local_f8,variable2);
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_f8._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_f8._8_8_);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_118._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_118._8_8_);
  }
  if (local_d8._M_string_length == 0) {
    if (!autoIds) goto LAB_00255a2b;
    makeUniqueId((string *)local_b8,idList);
    plVar3 = (long *)std::__cxx11::string::replace((ulong)local_b8,0,(char *)0x0,0x2b5444);
    local_f8._0_8_ = local_f8 + 0x10;
    pVVar5 = (VariablePairImpl *)(plVar3 + 2);
    if ((VariablePairImpl *)*plVar3 == pVVar5) {
      local_f8._16_8_ =
           (pVVar5->mVariable1).super___weak_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
      local_f8._24_8_ = plVar3[3];
    }
    else {
      local_f8._16_8_ =
           (pVVar5->mVariable1).super___weak_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
      local_f8._0_8_ = (VariablePairImpl *)*plVar3;
    }
    local_f8._8_8_ = plVar3[1];
    *plVar3 = (long)pVVar5;
    plVar3[1] = 0;
    *(undefined1 *)(plVar3 + 2) = 0;
    plVar3 = (long *)std::__cxx11::string::append(local_f8);
    pVVar5 = (VariablePairImpl *)(plVar3 + 2);
    if ((VariablePairImpl *)*plVar3 == pVVar5) {
      local_118._16_8_ =
           (pVVar5->mVariable1).super___weak_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
      _Stack_100._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)plVar3[3];
      local_118._0_8_ = pVVar10;
    }
    else {
      local_118._16_8_ =
           (pVVar5->mVariable1).super___weak_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
      local_118._0_8_ = (VariablePairImpl *)*plVar3;
    }
    local_118._8_8_ = plVar3[1];
    *plVar3 = (long)pVVar5;
    plVar3[1] = 0;
    *(undefined1 *)(plVar3 + 2) = 0;
    std::__cxx11::string::_M_append((char *)__return_storage_ptr__,local_118._0_8_);
    if ((VariablePairImpl *)local_118._0_8_ != pVVar10) {
      operator_delete((void *)local_118._0_8_,
                      (ulong)((long)&(((NamedEntity *)local_118._16_8_)->super_ParentedEntity).
                                     super_Entity._vptr_Entity + 1));
    }
    if ((VariablePairImpl *)local_f8._0_8_ != (VariablePairImpl *)(local_f8 + 0x10)) {
      operator_delete((void *)local_f8._0_8_,(ulong)(local_f8._16_8_ + 1));
    }
    peVar9 = (element_type *)local_b8._16_8_;
    pVVar10 = (VariablePairImpl *)local_b8._0_8_;
    if ((VariablePairImpl *)local_b8._0_8_ == pVVar6) goto LAB_00255a2b;
  }
  else {
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_f8,
                   " id=\"",&local_d8);
    plVar3 = (long *)std::__cxx11::string::append(local_f8);
    pVVar6 = (VariablePairImpl *)(plVar3 + 2);
    if ((VariablePairImpl *)*plVar3 == pVVar6) {
      local_118._16_8_ =
           (pVVar6->mVariable1).super___weak_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
      _Stack_100._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)plVar3[3];
      local_118._0_8_ = pVVar10;
    }
    else {
      local_118._16_8_ =
           (pVVar6->mVariable1).super___weak_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
      local_118._0_8_ = (VariablePairImpl *)*plVar3;
    }
    local_118._8_8_ = plVar3[1];
    *plVar3 = (long)pVVar6;
    plVar3[1] = 0;
    *(undefined1 *)(plVar3 + 2) = 0;
    std::__cxx11::string::_M_append((char *)__return_storage_ptr__,local_118._0_8_);
    if ((VariablePairImpl *)local_118._0_8_ != pVVar10) {
      operator_delete((void *)local_118._0_8_,
                      (ulong)((long)&(((NamedEntity *)local_118._16_8_)->super_ParentedEntity).
                                     super_Entity._vptr_Entity + 1));
    }
    peVar9 = (element_type *)local_f8._16_8_;
    pVVar10 = (VariablePairImpl *)local_f8._0_8_;
    if ((VariablePairImpl *)local_f8._0_8_ == (VariablePairImpl *)(local_f8 + 0x10))
    goto LAB_00255a2b;
  }
  operator_delete(pVVar10,(ulong)((long)&(peVar9->super_NamedEntity).super_ParentedEntity.
                                         super_Entity._vptr_Entity + 1));
LAB_00255a2b:
  std::__cxx11::string::append((char *)__return_storage_ptr__);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
    operator_delete(local_d8._M_dataplus._M_p,local_d8.field_2._M_allocated_capacity + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string printMapVariables(const VariablePairPtr &variablePair, IdList &idList, bool autoIds)
{
    std::string mapVariables = "<map_variables variable_1=\"" + variablePair->variable1()->name() + "\""
                               + " variable_2=\"" + variablePair->variable2()->name() + "\"";
    std::string mappingId = Variable::equivalenceMappingId(variablePair->variable1(), variablePair->variable2());
    if (!mappingId.empty()) {
        mapVariables += " id=\"" + mappingId + "\"";
    } else if (autoIds) {
        mapVariables += " id=\"" + makeUniqueId(idList) + "\"";
    }
    mapVariables += "/>";
    return mapVariables;
}